

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

tcache_t * tcaches_elm_remove(tsd_t *tsd,tcaches_t *elm,_Bool allow_reinit)

{
  byte in_DL;
  long *in_RSI;
  tcache_t *tcache;
  tsdn_t *in_stack_ffffffffffffffc8;
  tcache_t *local_10;
  
  malloc_mutex_assert_owner(in_stack_ffffffffffffffc8,(malloc_mutex_t *)0x273321);
  if (*in_RSI == 0) {
    local_10 = (tcache_t *)0x0;
  }
  else {
    local_10 = (tcache_t *)*in_RSI;
    if ((in_DL & 1) == 0) {
      *in_RSI = 0;
    }
    else {
      *in_RSI = 1;
    }
    if (local_10 == (tcache_t *)0x1) {
      local_10 = (tcache_t *)0x0;
    }
  }
  return local_10;
}

Assistant:

static tcache_t *
tcaches_elm_remove(tsd_t *tsd, tcaches_t *elm, bool allow_reinit) {
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &tcaches_mtx);

	if (elm->tcache == NULL) {
		return NULL;
	}
	tcache_t *tcache = elm->tcache;
	if (allow_reinit) {
		elm->tcache = TCACHES_ELM_NEED_REINIT;
	} else {
		elm->tcache = NULL;
	}

	if (tcache == TCACHES_ELM_NEED_REINIT) {
		return NULL;
	}
	return tcache;
}